

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O1

int str2role(char *str)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  Role *pRVar6;
  ulong uVar7;
  
  uVar7 = 0xffffffff;
  if ((str != (char *)0x0) && (cVar1 = *str, cVar1 != '\0')) {
    sVar4 = strlen(str);
    pRVar6 = roles;
    iVar3 = (int)sVar4;
    pcVar5 = "Archeologist";
    uVar7 = 0;
    do {
      pRVar6 = pRVar6 + 1;
      iVar2 = strncasecmp(str,pcVar5,(long)iVar3);
      if (iVar2 == 0) goto LAB_00234726;
      pcVar5 = pRVar6[-1].name.f;
      if (pcVar5 != (char *)0x0) {
        iVar2 = strncasecmp(str,pcVar5,(long)iVar3);
        if (iVar2 == 0) goto LAB_00234726;
      }
      iVar2 = strncasecmp(str,pRVar6[-1].filecode,0xffffffffffffffff);
      if (iVar2 == 0) goto LAB_00234726;
      uVar7 = uVar7 + 1;
      pcVar5 = (pRVar6->name).m;
    } while (uVar7 != 0xe);
    if (iVar3 == 1) {
      uVar7 = 0xfffffffe;
      if ((cVar1 == '*') || (cVar1 == '@')) goto LAB_00234726;
    }
    iVar3 = strncasecmp(str,"random",(long)iVar3);
    uVar7 = (ulong)(-(uint)(iVar3 == 0) - 1);
  }
LAB_00234726:
  return (int)uVar7;
}

Assistant:

int str2role(char *str)
{
	int i, len;

	/* Is str valid? */
	if (!str || !str[0])
	    return ROLE_NONE;

	/* Match as much of str as is provided */
	len = strlen(str);
	for (i = 0; roles[i].name.m; i++) {
	    /* Does it match the male name? */
	    if (!strncmpi(str, roles[i].name.m, len))
		return i;
	    /* Or the female name? */
	    if (roles[i].name.f && !strncmpi(str, roles[i].name.f, len))
		return i;
	    /* Or the filecode? */
	    if (!strcmpi(str, roles[i].filecode))
		return i;
	}

	if ((len == 1 && (*str == '*' || *str == '@')) ||
		!strncmpi(str, randomstr, len))
	    return ROLE_RANDOM;

	/* Couldn't find anything appropriate */
	return ROLE_NONE;
}